

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pre-process.c
# Opt level: O1

int handle_include_path(dmr_C *C,stream *stream,token **list,token *token,int how)

{
  char *__s;
  uint uVar1;
  int iVar2;
  token *ptVar3;
  size_t sVar4;
  char *pcVar5;
  long lVar6;
  int iVar7;
  token *token_00;
  char *pcVar8;
  char **ppcVar9;
  uint local_40;
  byte local_34;
  
  ptVar3 = token->next;
  if ((((ulong)ptVar3->pos & 0x3f) != 0x11) || ((ptVar3->field_2).special != 0x3c)) {
    expand_list(C,&token->next);
    ptVar3 = token->next;
    local_40 = 0;
    local_34 = 1;
    if ((((ulong)ptVar3->pos & 0x3f) != 0x11) || ((ptVar3->field_2).special != 0x3c))
    goto LAB_00120b8f;
  }
  local_40 = 0x3e;
  local_34 = 0;
  token = ptVar3;
LAB_00120b8f:
  ptVar3 = token->next;
  __s = C->preprocessor_tokenseqbuffer;
  token_00 = ptVar3;
  pcVar8 = __s;
  if (ptVar3 != &dmrC_eof_token_entry_) {
    do {
      uVar1 = SUB84(token_00->pos,0) & 0x3f;
      if ((uVar1 == 0x11) && ((token_00->field_2).special == local_40)) break;
      if (uVar1 == 0xf) {
        pcVar5 = (char *)((long)&((token_00->field_2).ident)->next + 4);
      }
      else {
        pcVar5 = dmrC_show_token(C,token_00);
      }
      sVar4 = strlen(pcVar5);
      memcpy(pcVar8,pcVar5,(long)(int)sVar4);
      pcVar8 = pcVar8 + (int)sVar4;
      token_00 = token_00->next;
    } while (token_00 != &dmrC_eof_token_entry_);
  }
  *pcVar8 = '\0';
  if ((local_34 == 0) &&
     ((((ulong)token_00->pos & 0x3f) != 0x11 || ((token_00->field_2).special != local_40)))) {
    dmrC_sparse_error(C,ptVar3->pos,"expected \'>\' at end of filename");
  }
  sVar4 = strlen(__s);
  iVar7 = (int)sVar4 + 1;
  if (*__s == '/') {
    iVar7 = try_include(C,"",__s,iVar7,list,C->includepath);
    if (iVar7 != 0) {
      return iVar7;
    }
  }
  else {
    if (how == 2) {
      ppcVar9 = C->includepath;
      C->includepath[0] = "";
    }
    else if (how == 1) {
      ppcVar9 = stream->next_path;
    }
    else {
      pcVar8 = stream->path;
      if (pcVar8 == (char *)0x0) {
        pcVar8 = stream->name;
        pcVar5 = strrchr(pcVar8,0x2f);
        if (pcVar5 == (char *)0x0) {
          pcVar8 = "";
        }
        else {
          lVar6 = (ulong)(uint)((int)pcVar5 - (int)pcVar8) << 0x20;
          pcVar8 = (char *)dmrC_allocator_allocate(&C->byte_allocator,lVar6 + 0x200000000 >> 0x20);
          sVar4 = lVar6 + 0x100000000 >> 0x20;
          memcpy(pcVar8,stream->name,sVar4);
          pcVar8[sVar4] = '\0';
        }
        stream->path = pcVar8;
      }
      C->includepath[0] = pcVar8;
      ppcVar9 = *(char ***)(C->date_buffer + (ulong)(local_34 ^ 1) * 8 + -0x28);
    }
    do {
      pcVar8 = *ppcVar9;
      if (pcVar8 == (char *)0x0) goto LAB_00120db1;
      iVar2 = try_include(C,pcVar8,__s,iVar7,list,ppcVar9 + 1);
      ppcVar9 = ppcVar9 + 1;
    } while (iVar2 == 0);
    if (pcVar8 != (char *)0x0) {
      return iVar2;
    }
  }
LAB_00120db1:
  dmrC_error_die(C,ptVar3->pos,"unable to open \'%s\'",__s);
}

Assistant:

static int handle_include_path(struct dmr_C *C, struct stream *stream, struct token **list, struct token *token, int how)
{
	const char *filename;
	struct token *next;
	const char **path;
	int expect;
	int flen;

	next = token->next;
	expect = '>';
	if (!dmrC_match_op(next, '<')) {
		expand_list(C, &token->next);
		expect = 0;
		next = token;
		if (dmrC_match_op(token->next, '<')) {
			next = token->next;
			expect = '>';
		}
	}

	token = next->next;
	filename = token_name_sequence(C, token, expect, token);
	flen = (int)strlen(filename) + 1;

	/* Absolute path? */
	if (filename[0] == '/') {
		if (try_include(C, "", filename, flen, list, C->includepath))
			return 0;
		goto out;
	}

	switch (how) {
	case 1:
		path = stream->next_path;
		break;
	case 2:
		C->includepath[0] = "";
		path = C->includepath;
		break;
	default:
		/* Dir of input file is first dir to search for quoted includes */
		set_stream_include_path(C, stream);
		path = expect ? C->angle_includepath : C->quote_includepath;
		break;
	}
	/* Check the standard include paths.. */
	if (do_include_path(C, path, list, token, filename, flen))
		return 0;
out:
	dmrC_error_die(C, token->pos, "unable to open '%s'", filename);
	return 0;
}